

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall duckdb::TaskScheduler::~TaskScheduler(TaskScheduler *this)

{
  RelaunchThreadsInternal(this,0);
  ::std::
  vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  ::~vector(&(this->markers).
             super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
           );
  ::std::
  vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  ::~vector(&(this->threads).
             super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
           );
  ::std::unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>::
  ~unique_ptr(&(this->queue).
               super_unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>
             );
  return;
}

Assistant:

TaskScheduler::~TaskScheduler() {
#ifndef DUCKDB_NO_THREADS
	try {
		RelaunchThreadsInternal(0);
	} catch (...) {
		// nothing we can do in the destructor if this fails
	}
#endif
}